

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.cpp
# Opt level: O0

void __thiscall Kdtree::print_data(Kdtree *this,vector<float,_std::allocator<float>_> *pt)

{
  size_type sVar1;
  reference pvVar2;
  ostream *poVar3;
  int local_1c;
  int i;
  vector<float,_std::allocator<float>_> *pt_local;
  Kdtree *this_local;
  
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<float,_std::allocator<float>_>::size(pt);
    if (sVar1 <= (ulong)(long)local_1c) break;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pt,(long)local_1c);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar2);
    std::operator<<(poVar3,", ");
    local_1c = local_1c + 1;
  }
  std::operator<<((ostream *)&std::cout,"\n");
  return;
}

Assistant:

void Kdtree::print_data(std::vector<numType> pt)
{
	for( auto i = 0; i < pt.size(); i++)
	{
	    std::cout<< pt[i] << ", ";
	}
	std::cout<<"\n";
}